

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

void htmlCharDataSAXCallback(htmlParserCtxtPtr ctxt,xmlChar *buf,int size,int mode)

{
  int iVar1;
  int local_24;
  int i;
  int mode_local;
  int size_local;
  xmlChar *buf_local;
  htmlParserCtxtPtr ctxt_local;
  
  if ((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) {
    if ((mode == 0) || ((mode == 1 || (ctxt->sax->cdataBlock == (cdataBlockSAXFunc)0x0)))) {
      i = size;
      _mode_local = buf;
      if ((ctxt->name == (xmlChar *)0x0) ||
         ((iVar1 = xmlStrEqual(ctxt->name,"html"), iVar1 != 0 ||
          (iVar1 = xmlStrEqual(ctxt->name,"head"), iVar1 != 0)))) {
        for (local_24 = 0;
            (local_24 < size &&
            ((buf[local_24] == ' ' ||
             (((8 < buf[local_24] && (buf[local_24] < 0xe)) && (buf[local_24] != '\v'))))));
            local_24 = local_24 + 1) {
        }
        if (0 < local_24) {
          if (ctxt->keepBlanks == 0) {
            if (ctxt->sax->ignorableWhitespace != (ignorableWhitespaceSAXFunc)0x0) {
              (*ctxt->sax->ignorableWhitespace)(ctxt->userData,buf,local_24);
            }
          }
          else if (ctxt->sax->characters != (charactersSAXFunc)0x0) {
            (*ctxt->sax->characters)(ctxt->userData,buf,local_24);
          }
          _mode_local = buf + local_24;
          i = size - local_24;
        }
        if (i < 1) {
          return;
        }
        htmlStartCharData(ctxt);
        if (1 < ctxt->disableSAX) {
          return;
        }
      }
      if (((mode == 0) && (ctxt->keepBlanks == 0)) &&
         (iVar1 = areBlanks(ctxt,_mode_local,i), 0 < iVar1)) {
        if (ctxt->sax->ignorableWhitespace != (ignorableWhitespaceSAXFunc)0x0) {
          (*ctxt->sax->ignorableWhitespace)(ctxt->userData,_mode_local,i);
        }
      }
      else if (ctxt->sax->characters != (charactersSAXFunc)0x0) {
        (*ctxt->sax->characters)(ctxt->userData,_mode_local,i);
      }
    }
    else {
      (*ctxt->sax->cdataBlock)(ctxt->userData,buf,size);
    }
  }
  return;
}

Assistant:

static void
htmlCharDataSAXCallback(htmlParserCtxtPtr ctxt, const xmlChar *buf,
                        int size, int mode) {
    if ((ctxt->sax == NULL) || (ctxt->disableSAX))
        return;

    if ((mode == 0) || (mode == DATA_RCDATA) ||
        (ctxt->sax->cdataBlock == NULL)) {
        if ((ctxt->name == NULL) ||
            (xmlStrEqual(ctxt->name, BAD_CAST "html")) ||
            (xmlStrEqual(ctxt->name, BAD_CAST "head"))) {
            int i;

            /*
             * Add leading whitespace to html or head elements before
             * calling htmlStartCharData.
             */
            for (i = 0; i < size; i++)
                if (!IS_WS_HTML(buf[i]))
                    break;

            if (i > 0) {
                if (!ctxt->keepBlanks) {
                    if (ctxt->sax->ignorableWhitespace != NULL)
                        ctxt->sax->ignorableWhitespace(ctxt->userData, buf, i);
                } else {
                    if (ctxt->sax->characters != NULL)
                        ctxt->sax->characters(ctxt->userData, buf, i);
                }

                buf += i;
                size -= i;
            }

            if (size <= 0)
                return;

            htmlStartCharData(ctxt);

            if (PARSER_STOPPED(ctxt))
                return;
        }

        if ((mode == 0) &&
            (!ctxt->keepBlanks) &&
            (areBlanks(ctxt, buf, size) > 0)) {
            if (ctxt->sax->ignorableWhitespace != NULL)
                ctxt->sax->ignorableWhitespace(ctxt->userData, buf, size);
        } else {
            if (ctxt->sax->characters != NULL)
                ctxt->sax->characters(ctxt->userData, buf, size);
        }
    } else {
        /*
         * Insert as CDATA, which is the same as HTML_PRESERVE_NODE
         */
        ctxt->sax->cdataBlock(ctxt->userData, buf, size);
    }
}